

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# acecRe.c
# Opt level: O2

void Ree_ManCutPrint(int *pCut,int Count,word Truth,int iObj)

{
  int nVars;
  undefined4 in_register_00000034;
  ulong uVar1;
  word Truth_local;
  
  Truth_local = Truth;
  printf("%d : %d : ",CONCAT44(in_register_00000034,Count),(ulong)(uint)iObj);
  for (uVar1 = 1; (long)uVar1 <= (long)*pCut; uVar1 = uVar1 + 1) {
    printf("%3d ",(ulong)(uint)pCut[uVar1]);
  }
  for (; (uint)uVar1 < 5; uVar1 = (ulong)((uint)uVar1 + 1)) {
    printf("    ");
  }
  printf("0x");
  Abc_TtPrintHexRev(_stdout,&Truth_local,nVars);
  putchar(10);
  return;
}

Assistant:

void Ree_ManCutPrint( int * pCut, int Count, word Truth, int iObj )
{
    int c;
    printf( "%d : %d : ", Count, iObj );
    for ( c = 1; c <= pCut[0]; c++ )
        printf( "%3d ", pCut[c] );
    for (      ; c <= 4; c++ )
        printf( "    " );
    printf( "0x" );
    Abc_TtPrintHexRev( stdout, &Truth, 3 );
    printf( "\n" );
}